

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

LengthData __thiscall QCss::ValueExtractor::lengthValue(ValueExtractor *this,Value *v)

{
  qreal qVar1;
  storage_type_conflict *psVar2;
  undefined1 *puVar3;
  char cVar4;
  byte bVar5;
  ulong uVar6;
  byte bVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  LengthData LVar14;
  undefined1 *local_58;
  storage_type_conflict *psStack_50;
  QArrayData *local_48;
  storage_type_conflict *psStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  psStack_40 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toString();
  puVar3 = local_38;
  psVar2 = psStack_40;
  local_58 = local_38;
  psStack_50 = psStack_40;
  bVar7 = 0;
  QVar8.m_data = psStack_40;
  QVar8.m_size = (qsizetype)local_38;
  QVar11.m_data = L"px";
  QVar11.m_size = 2;
  cVar4 = QtPrivate::endsWith(QVar8,QVar11,CaseInsensitive);
  if (cVar4 == '\0') {
    bVar7 = 0;
    QVar9.m_data = psVar2;
    QVar9.m_size = (qsizetype)puVar3;
    QVar12.m_data = L"ex";
    QVar12.m_size = 2;
    cVar4 = QtPrivate::endsWith(QVar9,QVar12,CaseInsensitive);
    if (cVar4 == '\0') {
      QVar10.m_data = psVar2;
      QVar10.m_size = (qsizetype)puVar3;
      QVar13.m_data = L"em";
      QVar13.m_size = 2;
      bVar5 = QtPrivate::endsWith(QVar10,QVar13,CaseInsensitive);
      bVar7 = bVar5 ^ 1;
      uVar6 = (ulong)((uint)bVar5 * 3);
    }
    else {
      uVar6 = 2;
    }
  }
  else {
    uVar6 = 1;
  }
  if (bVar7 == 0) {
    local_58 = puVar3 + -2;
  }
  else {
    uVar6 = (ulong)(v->type == Percentage) << 2;
  }
  qVar1 = (qreal)QStringView::toDouble((bool *)&local_58);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    LVar14._8_8_ = uVar6;
    LVar14.number = qVar1;
    return LVar14;
  }
  __stack_chk_fail();
}

Assistant:

LengthData ValueExtractor::lengthValue(const Value& v)
{
    const QString str = v.variant.toString();
    QStringView s(str);
    LengthData data;
    data.unit = LengthData::None;
    if (s.endsWith(u"px", Qt::CaseInsensitive))
        data.unit = LengthData::Px;
    else if (s.endsWith(u"ex", Qt::CaseInsensitive))
        data.unit = LengthData::Ex;
    else if (s.endsWith(u"em", Qt::CaseInsensitive))
        data.unit = LengthData::Em;

    if (data.unit != LengthData::None)
        s.chop(2);
    else if (v.type == Value::Percentage)
        data.unit = LengthData::Percent;

    data.number = s.toDouble();
    return data;
}